

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O1

void ncnn::draw_text_c1(uchar *pixels,int w,int h,int stride,char *text,int x,int y,
                       int fontpixelsize,uint color)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uchar *resized_font_bitmap;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uchar *puVar11;
  uchar *puVar12;
  long lVar13;
  ulong uVar14;
  
  resized_font_bitmap = (uchar *)operator_new__((ulong)(uint)(fontpixelsize * fontpixelsize * 2));
  sVar5 = strlen(text);
  if (0 < (int)(uint)sVar5) {
    uVar14 = 0;
    uVar7 = x;
    do {
      cVar1 = text[uVar14];
      if (cVar1 == ' ') {
        uVar4 = uVar7 + fontpixelsize;
      }
      else if (cVar1 == '\n') {
        y = y + fontpixelsize * 2;
        uVar4 = x;
      }
      else {
        iVar3 = isprint((int)cVar1);
        uVar4 = uVar7;
        if (iVar3 != 0) {
          resize_bilinear_font
                    ((uchar *)((long)cVar1 * 400 + 0x5f34c0),resized_font_bitmap,fontpixelsize);
          uVar8 = 0;
          if (0 < y) {
            uVar8 = y;
          }
          uVar10 = y + fontpixelsize * 2;
          if (h <= (int)uVar10) {
            uVar10 = h;
          }
          uVar6 = 0;
          if (0 < (int)uVar7) {
            uVar6 = uVar7;
          }
          uVar4 = uVar7 + fontpixelsize;
          uVar2 = w;
          if ((int)uVar4 < w) {
            uVar2 = uVar4;
          }
          if ((int)uVar8 < (int)uVar10) {
            uVar9 = (ulong)uVar8;
            puVar11 = pixels + (long)stride * uVar9 + (ulong)uVar6;
            puVar12 = resized_font_bitmap +
                      (((uVar9 - (long)y) * (long)fontpixelsize + (ulong)uVar6) - (long)(int)uVar7);
            do {
              if ((int)uVar6 < (int)uVar2) {
                lVar13 = 0;
                do {
                  puVar11[lVar13] =
                       (uchar)((ulong)((puVar12[lVar13] ^ 0xff) * (uint)puVar11[lVar13] +
                                      (color & 0xff) * (uint)puVar12[lVar13]) * 0x1010102 >> 0x20);
                  lVar13 = lVar13 + 1;
                } while (uVar2 - uVar6 != (int)lVar13);
              }
              uVar9 = uVar9 + 1;
              puVar11 = puVar11 + stride;
              puVar12 = puVar12 + fontpixelsize;
            } while (uVar9 != uVar10);
          }
        }
      }
      uVar7 = uVar4;
      uVar14 = uVar14 + 1;
    } while (uVar14 != ((uint)sVar5 & 0x7fffffff));
  }
  operator_delete__(resized_font_bitmap);
  return;
}

Assistant:

void draw_text_c1(unsigned char* pixels, int w, int h, int stride, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned char* resized_font_bitmap = new unsigned char[fontpixelsize * fontpixelsize * 2];

    const int n = strlen(text);

    int cursor_x = x;
    int cursor_y = y;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            cursor_x = x;
            cursor_y += fontpixelsize * 2;
            continue;
        }

        if (ch == ' ')
        {
            cursor_x += fontpixelsize;
            continue;
        }

        if (isprint(ch) != 0)
        {
            const unsigned char* font_bitmap = mono_font_data[ch - '!'];

            // draw resized character
            resize_bilinear_font(font_bitmap, resized_font_bitmap, fontpixelsize);

            const int ystart = std::max(cursor_y, 0);
            const int yend = std::min(cursor_y + fontpixelsize * 2, h);
            const int xstart = std::max(cursor_x, 0);
            const int xend = std::min(cursor_x + fontpixelsize, w);

            for (int j = ystart; j < yend; j++)
            {
                const unsigned char* palpha = resized_font_bitmap + (j - cursor_y) * fontpixelsize + xstart - cursor_x;
                unsigned char* p = pixels + stride * j + xstart;

                for (int k = xstart; k < xend; k++)
                {
                    unsigned char alpha = *palpha++;

                    p[0] = (p[0] * (255 - alpha) + pen_color[0] * alpha) / 255;
                    p += 1;
                }
            }

            cursor_x += fontpixelsize;
        }
    }

    delete[] resized_font_bitmap;
}